

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEmbeddedFileDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
          (QPDFEmbeddedFileDocumentHelper *this,QPDF *qpdf)

{
  bool bVar1;
  Members *__p;
  allocator<char> local_69;
  QPDFObjectHandle embedded_files;
  __shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2> local_58 [2];
  QPDFObjectHandle names;
  QPDFObjectHandle root;
  
  (this->super_QPDFDocumentHelper).qpdf = qpdf;
  (this->super_QPDFDocumentHelper)._vptr_QPDFDocumentHelper =
       (_func_int **)&PTR__QPDFEmbeddedFileDocumentHelper_002ad538;
  __p = (Members *)operator_new(0x10);
  (__p->embedded_files).super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__p->embedded_files).super___shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,void>
            ((__shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,(__gnu_cxx::_Lock_policy)2> *)
             &this->m,__p);
  QPDF::getRoot((QPDF *)&root);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"/Names",(allocator<char> *)&embedded_files);
  QPDFObjectHandle::getKey(&names,(string *)&root);
  std::__cxx11::string::~string((string *)local_58);
  bVar1 = QPDFObjectHandle::isDictionary(&names);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_58,"/EmbeddedFiles",&local_69);
    QPDFObjectHandle::getKey(&embedded_files,(string *)&names);
    std::__cxx11::string::~string((string *)local_58);
    bVar1 = QPDFObjectHandle::isDictionary(&embedded_files);
    if (bVar1) {
      std::make_shared<QPDFNameTreeObjectHelper,QPDFObjectHandle&,QPDF&>
                ((QPDFObjectHandle *)local_58,(QPDF *)&embedded_files);
      std::__shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2> *)
                 (this->m).
                 super___shared_ptr<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58[0]._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&embedded_files.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&names.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&root.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper(QPDF& qpdf) :
    QPDFDocumentHelper(qpdf),
    m(new Members())
{
    auto root = qpdf.getRoot();
    auto names = root.getKey("/Names");
    if (names.isDictionary()) {
        auto embedded_files = names.getKey("/EmbeddedFiles");
        if (embedded_files.isDictionary()) {
            m->embedded_files = std::make_shared<QPDFNameTreeObjectHelper>(embedded_files, qpdf);
        }
    }
}